

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O2

int re_doreplace(RSIZE plen,char *st)

{
  int iVar1;
  byte bVar2;
  byte local_148 [8];
  char repstr [256];
  
  iVar1 = 0;
  bVar2 = 1;
  while( true ) {
    while( true ) {
      do {
        if (bVar2 == 0) {
          local_148[iVar1] = 0;
          iVar1 = lreplace(plen,(char *)local_148);
          return iVar1;
        }
        bVar2 = *st;
      } while (bVar2 == 0);
      if (bVar2 != 0x5c) break;
      st = (char *)((byte *)st + 1);
      bVar2 = 1;
    }
    local_148[iVar1] = bVar2;
    if (0xfe < iVar1) break;
    iVar1 = iVar1 + 1;
    st = (char *)((byte *)st + 1);
    bVar2 = 1;
  }
  return 0;
}

Assistant:

static int
re_doreplace(RSIZE plen, char *st)
{
	int	 j, k, s, more, num, state;
	struct line	*clp;
	char	 repstr[REPLEN];

	clp = curwp->w_dotp;
	more = TRUE;
	j = 0;
	state = 0;
	num = 0;

	/* The following FSA parses the replacement string */
	while (more) {
		switch (state) {
		case 0:
			if (*st == '\\') {
				st++;
				state = 1;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
			}
			break;
		case 1:
			if (*st >= '0' && *st <= '9') {
				num = *st - '0';
				st++;
				state = 2;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
				state = 0;
			}
			break;
		case 2:
			if (*st >= '0' && *st <= '9') {
				num = 10 * num + *st - '0';
				st++;
			} else {
				if (num >= RE_NMATCH)
					return (FALSE);
				k = regex_match[num].rm_eo - regex_match[num].rm_so;
				if (j + k >= REPLEN)
					return (FALSE);
				bcopy(&(clp->l_text[regex_match[num].rm_so]),
				    &repstr[j], k);
				j += k;
				if (*st == '\0')
					more = FALSE;
				if (*st == '\\') {
					st++;
					state = 1;
				} else {
					repstr[j] = *st;
					j++;
					if (j >= REPLEN)
						return (FALSE);
					st++;
					state = 0;
				}
			}
			break;
		}		/* switch (state) */
	}			/* while (more)   */

	repstr[j] = '\0';
	s = lreplace(plen, repstr);
	return (s);
}